

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_dispatch.cpp
# Opt level: O0

void __kmp_dispatch_init_algorithm<unsigned_long_long>
               (ident_t *loc,int gtid,dispatch_private_info_template<unsigned_long_long> *pr,
               sched_type schedule,unsigned_long_long lb,unsigned_long_long ub,signed_t_conflict st,
               kmp_uint64 *cur_chunk,signed_t_conflict chunk,unsigned_long_long nproc,
               unsigned_long_long tid)

{
  bool bVar1;
  undefined1 base [16];
  int iVar2;
  ulong uVar3;
  long lVar4;
  kmp_int64 *pkVar5;
  longdouble *plVar6;
  longdouble *__return_storage_ptr__;
  unsigned_t_conflict uVar7;
  sched_type in_ECX;
  char *msg;
  long *in_RDX;
  int in_ESI;
  char *y;
  ulong in_R8;
  ulong in_R9;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble x_00;
  longdouble in_ST2;
  longdouble lVar8;
  longdouble in_ST3;
  longdouble lVar9;
  longdouble lVar10;
  longdouble lVar11;
  longdouble lVar12;
  undefined1 auVar13 [16];
  ulong in_stack_00000008;
  ulong *in_stack_00000010;
  ulong in_stack_00000018;
  ulong in_stack_00000020;
  ulong in_stack_00000028;
  unsigned_long_long parm4;
  unsigned_long_long parm3;
  unsigned_long_long parm2;
  unsigned_long_long parm1;
  longdouble p;
  UT mid;
  UT right;
  UT left;
  UT cross;
  longdouble target;
  DBL x;
  unsigned_long_long nth;
  unsigned_long_long ub_tmp;
  unsigned_long_long extras_1;
  unsigned_long_long small_chunk_1;
  unsigned_long_long id_1;
  unsigned_long_long limit;
  unsigned_long_long init_1;
  unsigned_long_long extras;
  unsigned_long_long small_chunk;
  unsigned_long_long id;
  unsigned_long_long init;
  unsigned_long_long ntc;
  int itt_need_metadata_reporting;
  bool use_hier;
  int monotonicity;
  kmp_team_t *team;
  kmp_info_t *th;
  unsigned_long_long tc;
  int active;
  undefined2 in_stack_fffffffffffffd80;
  undefined6 in_stack_fffffffffffffd82;
  ulong local_238;
  undefined7 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddf;
  cons_type in_stack_fffffffffffffde0;
  kmp_i18n_id_t in_stack_fffffffffffffde4;
  undefined8 in_stack_fffffffffffffde8;
  ulong local_210;
  unsigned_long_long in_stack_fffffffffffffdf8;
  ulong local_200;
  ulong local_1f8;
  undefined8 in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  char *in_stack_fffffffffffffe20;
  bool local_1d1;
  undefined1 local_198 [24];
  ulong local_158;
  ulong local_150;
  longdouble local_148;
  longdouble *local_130;
  longdouble *local_128;
  ulong local_c8;
  ulong local_c0;
  undefined1 local_78 [28];
  uint local_5c;
  byte local_55;
  int local_54;
  kmp_team_p *local_50;
  kmp_info_t *local_48;
  ulong local_40;
  uint local_34;
  ulong local_30;
  ulong local_28;
  sched_type local_1c;
  long *local_18;
  
  local_48 = __kmp_threads[in_ESI];
  local_50 = (local_48->th).th_team;
  local_34 = (uint)(((local_50->t).t_serialized != 0 ^ 0xffU) & 1);
  local_1d1 = false;
  local_30 = in_R9;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_RDX;
  if ((__kmp_itt_metadata_add_ptr__3_0 != (__kmp_itt_metadata_add_t *)0x0) &&
     (local_1d1 = false, __kmp_forkjoin_frames_mode == 3)) {
    iVar2 = __kmp_tid_from_gtid(in_ESI);
    local_1d1 = false;
    if ((iVar2 == 0) && (local_1d1 = false, (local_48->th).th_teams_microtask == (microtask_t)0x0))
    {
      local_1d1 = (local_50->t).t_active_level == 1;
    }
  }
  local_5c = (uint)local_1d1;
  local_55 = 0;
  y = (char *)0x0;
  local_54 = __kmp_get_monotonicity(local_1c,false);
  local_1c = local_1c & ~(kmp_sch_modifier_nonmonotonic|kmp_sch_modifier_monotonic);
  if (((int)local_1c < 0xa0) || (199 < (int)local_1c)) {
    *(uint *)((long)local_18 + 0x84) = *(uint *)((long)local_18 + 0x84) & 0xfffffffd;
  }
  else {
    *(uint *)((long)local_18 + 0x84) = *(uint *)((long)local_18 + 0x84) & 0xfffffffd | 2;
    local_1c = local_1c - 0x80;
  }
  *(undefined4 *)(local_18 + 0x15) = 8;
  if ((local_1c & kmp_ord_lower) == 0) {
    *(uint *)((long)local_18 + 0x84) = *(uint *)((long)local_18 + 0x84) & 0xfffffffe;
  }
  else {
    *(uint *)((long)local_18 + 0x84) = *(uint *)((long)local_18 + 0x84) & 0xfffffffe | 1;
    local_1c = local_1c - kmp_sch_lower;
  }
  if ((*(uint *)((long)local_18 + 0x84) & 1) != 0) {
    local_54 = 1;
  }
  if (local_1c == kmp_sch_default) {
    local_1c = __kmp_static;
  }
  else {
    if (local_1c == kmp_sch_runtime) {
      local_1c = (local_50->t).t_sched.field_0.r_sched_type;
      y = (char *)(ulong)(local_55 & 1);
      local_54 = __kmp_get_monotonicity(local_1c,(bool)(local_55 & 1));
      local_1c = local_1c & ~(kmp_sch_modifier_nonmonotonic|kmp_sch_modifier_monotonic);
      if (local_1c == kmp_sch_guided_chunked) {
        local_1c = __kmp_guided;
      }
      else if (local_1c == kmp_sch_default) {
        local_1c = __kmp_static;
      }
      in_stack_00000018 = (ulong)(local_50->t).t_sched.field_0.chunk;
      if (in_stack_00000010 != (ulong *)0x0) {
        *in_stack_00000010 = in_stack_00000018;
      }
    }
    else {
      if (local_1c == kmp_sch_guided_chunked) {
        local_1c = __kmp_guided;
      }
      if ((long)in_stack_00000018 < 1) {
        in_stack_00000018 = 1;
      }
    }
    if (local_1c == kmp_sch_auto) {
      local_1c = __kmp_auto;
    }
    if ((local_1c == kmp_sch_dynamic_chunked) && (local_54 == 0)) {
      local_1c = kmp_sch_static_steal;
    }
    if ((local_1c == kmp_sch_guided_analytical_chunked) && (0x100000 < in_stack_00000020)) {
      local_1c = kmp_sch_guided_iterative_chunked;
      y = (char *)0x40059;
      __kmp_msg_format((uint)local_78);
      in_stack_fffffffffffffd80 = (undefined2)local_78._8_8_;
      in_stack_fffffffffffffd82 = SUB86(local_78._8_8_,2);
      __kmp_msg(kmp_ms_warning);
    }
    if (local_1c == kmp_sch_runtime_simd) {
      local_1c = (local_50->t).t_sched.field_0.r_sched_type;
      y = (char *)(ulong)(local_55 & 1);
      local_54 = __kmp_get_monotonicity(local_1c,(bool)(local_55 & 1));
      local_1c = local_1c & ~(kmp_sch_modifier_nonmonotonic|kmp_sch_modifier_monotonic);
      if (((local_1c == kmp_sch_default) || (local_1c == kmp_sch_auto)) ||
         (local_1c == __kmp_static)) {
        local_1c = kmp_sch_static_balanced_chunked;
      }
      else {
        if ((local_1c == kmp_sch_guided_chunked) || (local_1c == __kmp_guided)) {
          local_1c = kmp_sch_guided_simd;
        }
        in_stack_00000018 = (long)(local_50->t).t_sched.field_0.chunk * in_stack_00000018;
      }
      if (in_stack_00000010 != (ulong *)0x0) {
        *in_stack_00000010 = in_stack_00000018;
      }
    }
    local_18[8] = in_stack_00000018;
  }
  if (((int)local_1c < 0x21) || (0x2f < (int)local_1c)) {
    y = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/jmellorcrummey[P]llvm-openmp-5/runtime/src/kmp_dispatch.cpp"
    ;
    __kmp_debug_assert(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                       (int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
  }
  *local_18 = 0;
  if ((__kmp_env_consistency_check != 0) && (in_stack_00000008 == 0)) {
    y = (char *)0x2;
    if ((*(uint *)((long)local_18 + 0x84) & 1) != 0) {
      y = (char *)0x3;
    }
    __kmp_error_construct
              (in_stack_fffffffffffffde4,in_stack_fffffffffffffde0,
               (ident_t *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
  }
  if (in_stack_00000008 == 1) {
    if (local_30 < local_28) {
      local_40 = 0;
    }
    else {
      local_40 = (local_30 - local_28) + 1;
    }
  }
  else if ((long)in_stack_00000008 < 0) {
    if (local_28 < local_30) {
      local_40 = 0;
    }
    else {
      local_40 = (local_28 - local_30) / -in_stack_00000008 + 1;
    }
  }
  else if (local_30 < local_28) {
    local_40 = 0;
  }
  else {
    local_40 = (local_30 - local_28) / in_stack_00000008 + 1;
  }
  local_18[2] = local_28;
  local_18[1] = local_30;
  local_18[3] = in_stack_00000008;
  local_18[4] = local_40;
  if ((local_34 != 0) && ((*(uint *)((long)local_18 + 0x84) & 1) != 0)) {
    *(undefined4 *)(local_18 + 0x11) = 0;
    local_18[0xc] = 1;
    local_18[0xd] = 0;
  }
  msg = (char *)(ulong)(local_1c - kmp_sch_static_chunked);
  switch(msg) {
  case (char *)0x0:
  case (char *)0x2:
    if (local_18[8] == 0) {
      local_18[8] = 1;
    }
    break;
  default:
    __kmp_msg_format((uint)&stack0xfffffffffffffe80,0x40058);
    __kmp_msg_format((uint)local_198,0x50016);
    __kmp_fatal();
  case (char *)0x6:
    local_150 = in_stack_00000018;
    local_158 = local_40 / (in_stack_00000020 << 1);
    if (local_158 == 0) {
      local_158 = 1;
    }
    if (in_stack_00000018 == 0) {
      local_150 = 1;
    }
    else if (local_158 < in_stack_00000018) {
      local_150 = local_158;
    }
    uVar3 = ((local_40 * 2 + local_158 + local_150) - 1) / (local_158 + local_150);
    if (uVar3 < 2) {
      uVar3 = 2;
    }
    local_18[8] = local_150;
    local_18[9] = local_158;
    local_18[10] = uVar3;
    local_18[0xb] = (local_158 - local_150) / (uVar3 - 1);
    break;
  case (char *)0x7:
    if (in_stack_00000020 < 2) {
      local_238 = local_40;
    }
    else {
      local_238 = ((local_40 + in_stack_00000020) - 1) / in_stack_00000020;
    }
    local_18[8] = local_238;
    break;
  case (char *)0x8:
    goto switchD_00196c0e_caseD_8;
  case (char *)0x9:
  case (char *)0xd:
    if (in_stack_00000020 < 2) {
      local_1c = kmp_sch_static_greedy;
      local_18[8] = local_40;
    }
    else if ((in_stack_00000018 * 2 + 1) * in_stack_00000020 < local_40) {
      local_18[9] = in_stack_00000020 * (in_stack_00000018 + 1) * 2;
      auVar13._8_4_ = (int)(in_stack_00000020 >> 0x20);
      auVar13._0_8_ = in_stack_00000020;
      auVar13._12_4_ = 0x45300000;
      local_18[10] = (long)(0.5 / ((auVar13._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)in_stack_00000020) -
                                  4503599627370496.0)));
    }
    else {
      local_1c = kmp_sch_dynamic_chunked;
    }
    break;
  case (char *)0xa:
    if (in_stack_00000020 < 2) {
      local_1c = kmp_sch_static_greedy;
      local_18[8] = local_40;
    }
    else if ((in_stack_00000018 * 2 + 1) * in_stack_00000020 < local_40) {
      lVar8 = (((longdouble)*(float *)(&DAT_001dabf0 + (ulong)((long)in_stack_00000020 < 0) * 4) +
               (longdouble)(long)in_stack_00000020) *
              ((longdouble)(long)in_stack_00000018 + (longdouble)(long)in_stack_00000018 +
              (longdouble)1)) /
              ((longdouble)*(float *)(&DAT_001dabf0 + (ulong)((long)local_40 < 0) * 4) +
              (longdouble)(long)local_40);
      x_00 = (longdouble)-0.5 /
             ((longdouble)*(float *)(&DAT_001dabf0 + (ulong)((long)in_stack_00000020 < 0) * 4) +
             (longdouble)(long)in_stack_00000020) + (longdouble)1;
      *(longdouble *)(local_18 + 10) = x_00;
      local_130 = (longdouble *)0xe5;
      lVar9 = in_ST3;
      lVar10 = in_ST3;
      lVar12 = in_ST3;
      __kmp_pow<unsigned_long_long>((longdouble *)0xe5,x_00,(unsigned_long_long)y);
      local_148 = in_ST0;
      plVar6 = local_130;
      if (in_ST0 <= lVar8) {
        local_128 = (longdouble *)0x0;
      }
      else {
        do {
          local_130 = plVar6;
          local_148 = local_148 * local_148;
          plVar6 = (longdouble *)((long)local_130 << 1);
          in_stack_fffffffffffffddf = lVar8 < local_148 && plVar6 < (longdouble *)0x8000000;
        } while ((bool)in_stack_fffffffffffffddf);
        local_128 = (longdouble *)((ulong)local_130 & 0x7fffffffffffffff);
      }
      while (local_130 = plVar6, lVar11 = lVar12,
            iVar2 = (int)((ulong)in_stack_fffffffffffffe10 >> 0x20),
            (longdouble *)((long)local_128 + 1U) < local_130) {
        __return_storage_ptr__ = (longdouble *)((ulong)((long)local_128 + (long)local_130) >> 1);
        lVar12 = lVar11;
        __kmp_pow<unsigned_long_long>(__return_storage_ptr__,x_00,(unsigned_long_long)y);
        bVar1 = lVar8 < in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = lVar9;
        lVar9 = lVar10;
        lVar10 = lVar11;
        plVar6 = __return_storage_ptr__;
        if (bVar1) {
          plVar6 = local_130;
          local_128 = __return_storage_ptr__;
        }
      }
      if (((local_130 == (longdouble *)0x0) ||
          (__kmp_pow<unsigned_long_long>
                     ((longdouble *)((long)local_130 + -1),x_00,(unsigned_long_long)y),
          in_ST1 <= lVar8)) ||
         (__kmp_pow<unsigned_long_long>(local_130,x_00,(unsigned_long_long)y), lVar8 < in_ST2)) {
        __kmp_debug_assert(msg,in_stack_fffffffffffffe18,iVar2);
      }
      uVar3 = local_40;
      local_18[9] = (long)local_130;
      base._4_4_ = in_stack_fffffffffffffde4;
      base._0_4_ = in_stack_fffffffffffffde0;
      base._8_8_ = in_stack_fffffffffffffde8;
      uVar7 = __kmp_dispatch_guided_remaining<unsigned_long_long>
                        (in_stack_fffffffffffffdf8,(floating_t_conflict)base,
                         CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
      *local_18 = (uVar3 - uVar7) - (long)local_130 * in_stack_00000018;
    }
    else {
      local_1c = kmp_sch_dynamic_chunked;
    }
    break;
  case (char *)0xb:
    uVar3 = (long)(int)(uint)(local_40 % in_stack_00000018 != 0) + local_40 / in_stack_00000018;
    if ((1 < in_stack_00000020) && (in_stack_00000020 <= uVar3)) {
      local_200 = uVar3 / in_stack_00000020;
      uVar3 = uVar3 % in_stack_00000020;
      local_1f8 = uVar3;
      if (in_stack_00000028 < uVar3) {
        local_1f8 = in_stack_00000028;
      }
      lVar4 = in_stack_00000028 * local_200 + local_1f8;
      *local_18 = lVar4;
      local_18[1] = lVar4 + local_200 + (long)(int)(uint)(in_stack_00000028 < uVar3);
      local_18[9] = local_28;
      if (local_200 + uVar3 < in_stack_00000020) {
        local_200 = local_200 + uVar3;
      }
      else {
        local_200 = in_stack_00000020;
      }
      local_18[10] = local_200;
      local_18[0xb] = (in_stack_00000028 + 1) % in_stack_00000020;
      local_18[3] = in_stack_00000008;
      pkVar5 = (kmp_int64 *)
               ___kmp_allocate(CONCAT62(in_stack_fffffffffffffd82,in_stack_fffffffffffffd80));
      (((local_48->th).th_dispatch)->field_8).th_doacross_info = pkVar5;
      __kmp_init_lock((kmp_lock_t *)0x196e62);
      break;
    }
    local_1c = kmp_sch_static_balanced;
switchD_00196c0e_caseD_8:
    if (in_stack_00000020 < 2) {
      if (local_40 == 0) {
        *local_18 = 1;
        local_18[8] = 0;
        break;
      }
      local_c0 = 0;
      local_c8 = local_40 - 1;
      local_18[8] = 1;
    }
    else if (local_40 < in_stack_00000020) {
      if (local_40 <= in_stack_00000028) {
        *local_18 = 1;
        local_18[8] = 0;
        break;
      }
      local_c0 = in_stack_00000028;
      local_c8 = in_stack_00000028;
      local_18[8] = (ulong)(in_stack_00000028 == local_40 - 1);
    }
    else {
      uVar3 = local_40 % in_stack_00000020;
      local_210 = uVar3;
      if (in_stack_00000028 < uVar3) {
        local_210 = in_stack_00000028;
      }
      local_c0 = in_stack_00000028 * (local_40 / in_stack_00000020) + local_210;
      local_c8 = (local_c0 + local_40 / in_stack_00000020) -
                 (long)(int)(uint)(uVar3 <= in_stack_00000028);
      local_18[8] = (ulong)(in_stack_00000028 == in_stack_00000020 - 1);
    }
    if ((local_5c != 0) && (in_stack_00000010 != (ulong *)0x0)) {
      *in_stack_00000010 = (local_c8 - local_c0) + 1;
    }
    if (in_stack_00000008 == 1) {
      local_18[2] = local_28 + local_c0;
      local_18[1] = local_28 + local_c8;
    }
    else {
      uVar3 = local_28 + local_c8 * in_stack_00000008;
      local_18[2] = local_28 + local_c0 * in_stack_00000008;
      if ((long)in_stack_00000008 < 1) {
        if (uVar3 + in_stack_00000008 < local_30) {
          uVar3 = local_30;
        }
        local_18[1] = uVar3;
      }
      else {
        if (local_30 < uVar3 + in_stack_00000008) {
          uVar3 = local_30;
        }
        local_18[1] = uVar3;
      }
    }
    if ((*(uint *)((long)local_18 + 0x84) & 1) != 0) {
      local_18[0xc] = local_c0;
      local_18[0xd] = local_c8;
    }
    break;
  case (char *)0xc:
    local_1c = kmp_sch_static_greedy;
    if (in_stack_00000020 < 2) {
      local_18[8] = local_40;
    }
    else {
      local_18[8] = (((local_40 + in_stack_00000020) - 1) / in_stack_00000020 + in_stack_00000018) -
                    1 & (in_stack_00000018 - 1 ^ 0xffffffffffffffff);
    }
  }
  *(sched_type *)(local_18 + 0x10) = local_1c;
  return;
}

Assistant:

void __kmp_dispatch_init_algorithm(ident_t *loc, int gtid,
                                   dispatch_private_info_template<T> *pr,
                                   enum sched_type schedule, T lb, T ub,
                                   typename traits_t<T>::signed_t st,
#if USE_ITT_BUILD
                                   kmp_uint64 *cur_chunk,
#endif
                                   typename traits_t<T>::signed_t chunk,
                                   T nproc, T tid) {
  typedef typename traits_t<T>::unsigned_t UT;
  typedef typename traits_t<T>::floating_t DBL;

  int active;
  T tc;
  kmp_info_t *th;
  kmp_team_t *team;
  int monotonicity;
  bool use_hier;

#ifdef KMP_DEBUG
  typedef typename traits_t<T>::signed_t ST;
  {
    char *buff;
    // create format specifiers before the debug output
    buff = __kmp_str_format("__kmp_dispatch_init_algorithm: T#%%d called "
                            "pr:%%p lb:%%%s ub:%%%s st:%%%s "
                            "schedule:%%d chunk:%%%s nproc:%%%s tid:%%%s\n",
                            traits_t<T>::spec, traits_t<T>::spec,
                            traits_t<ST>::spec, traits_t<ST>::spec,
                            traits_t<T>::spec, traits_t<T>::spec);
    KD_TRACE(10, (buff, gtid, pr, lb, ub, st, schedule, chunk, nproc, tid));
    __kmp_str_free(&buff);
  }
#endif
  /* setup data */
  th = __kmp_threads[gtid];
  team = th->th.th_team;
  active = !team->t.t_serialized;

#if USE_ITT_BUILD
  int itt_need_metadata_reporting =
      __itt_metadata_add_ptr && __kmp_forkjoin_frames_mode == 3 &&
      KMP_MASTER_GTID(gtid) && th->th.th_teams_microtask == NULL &&
      team->t.t_active_level == 1;
#endif

#if KMP_USE_HIER_SCHED
  use_hier = pr->flags.use_hier;
#else
  use_hier = false;
#endif

  /* Pick up the nonmonotonic/monotonic bits from the scheduling type */
  monotonicity = __kmp_get_monotonicity(schedule, use_hier);
  schedule = SCHEDULE_WITHOUT_MODIFIERS(schedule);

  /* Pick up the nomerge/ordered bits from the scheduling type */
  if ((schedule >= kmp_nm_lower) && (schedule < kmp_nm_upper)) {
    pr->flags.nomerge = TRUE;
    schedule =
        (enum sched_type)(((int)schedule) - (kmp_nm_lower - kmp_sch_lower));
  } else {
    pr->flags.nomerge = FALSE;
  }
  pr->type_size = traits_t<T>::type_size; // remember the size of variables
  if (kmp_ord_lower & schedule) {
    pr->flags.ordered = TRUE;
    schedule =
        (enum sched_type)(((int)schedule) - (kmp_ord_lower - kmp_sch_lower));
  } else {
    pr->flags.ordered = FALSE;
  }
  // Ordered overrides nonmonotonic
  if (pr->flags.ordered) {
    monotonicity = SCHEDULE_MONOTONIC;
  }

  if (schedule == kmp_sch_static) {
    schedule = __kmp_static;
  } else {
    if (schedule == kmp_sch_runtime) {
      // Use the scheduling specified by OMP_SCHEDULE (or __kmp_sch_default if
      // not specified)
      schedule = team->t.t_sched.r_sched_type;
      monotonicity = __kmp_get_monotonicity(schedule, use_hier);
      schedule = SCHEDULE_WITHOUT_MODIFIERS(schedule);
      // Detail the schedule if needed (global controls are differentiated
      // appropriately)
      if (schedule == kmp_sch_guided_chunked) {
        schedule = __kmp_guided;
      } else if (schedule == kmp_sch_static) {
        schedule = __kmp_static;
      }
      // Use the chunk size specified by OMP_SCHEDULE (or default if not
      // specified)
      chunk = team->t.t_sched.chunk;
#if USE_ITT_BUILD
      if (cur_chunk)
        *cur_chunk = chunk;
#endif
#ifdef KMP_DEBUG
      {
        char *buff;
        // create format specifiers before the debug output
        buff = __kmp_str_format("__kmp_dispatch_init_algorithm: T#%%d new: "
                                "schedule:%%d chunk:%%%s\n",
                                traits_t<ST>::spec);
        KD_TRACE(10, (buff, gtid, schedule, chunk));
        __kmp_str_free(&buff);
      }
#endif
    } else {
      if (schedule == kmp_sch_guided_chunked) {
        schedule = __kmp_guided;
      }
      if (chunk <= 0) {
        chunk = KMP_DEFAULT_CHUNK;
      }
    }

    if (schedule == kmp_sch_auto) {
      // mapping and differentiation: in the __kmp_do_serial_initialize()
      schedule = __kmp_auto;
#ifdef KMP_DEBUG
      {
        char *buff;
        // create format specifiers before the debug output
        buff = __kmp_str_format(
            "__kmp_dispatch_init_algorithm: kmp_sch_auto: T#%%d new: "
            "schedule:%%d chunk:%%%s\n",
            traits_t<ST>::spec);
        KD_TRACE(10, (buff, gtid, schedule, chunk));
        __kmp_str_free(&buff);
      }
#endif
    }
#if KMP_STATIC_STEAL_ENABLED
    // map nonmonotonic:dynamic to static steal
    if (schedule == kmp_sch_dynamic_chunked) {
      if (monotonicity == SCHEDULE_NONMONOTONIC)
        schedule = kmp_sch_static_steal;
    }
#endif
    /* guided analytical not safe for too many threads */
    if (schedule == kmp_sch_guided_analytical_chunked && nproc > 1 << 20) {
      schedule = kmp_sch_guided_iterative_chunked;
      KMP_WARNING(DispatchManyThreads);
    }
    if (schedule == kmp_sch_runtime_simd) {
      // compiler provides simd_width in the chunk parameter
      schedule = team->t.t_sched.r_sched_type;
      monotonicity = __kmp_get_monotonicity(schedule, use_hier);
      schedule = SCHEDULE_WITHOUT_MODIFIERS(schedule);
      // Detail the schedule if needed (global controls are differentiated
      // appropriately)
      if (schedule == kmp_sch_static || schedule == kmp_sch_auto ||
          schedule == __kmp_static) {
        schedule = kmp_sch_static_balanced_chunked;
      } else {
        if (schedule == kmp_sch_guided_chunked || schedule == __kmp_guided) {
          schedule = kmp_sch_guided_simd;
        }
        chunk = team->t.t_sched.chunk * chunk;
      }
#if USE_ITT_BUILD
      if (cur_chunk)
        *cur_chunk = chunk;
#endif
#ifdef KMP_DEBUG
      {
        char *buff;
        // create format specifiers before the debug output
        buff = __kmp_str_format(
            "__kmp_dispatch_init_algorithm: T#%%d new: schedule:%%d"
            " chunk:%%%s\n",
            traits_t<ST>::spec);
        KD_TRACE(10, (buff, gtid, schedule, chunk));
        __kmp_str_free(&buff);
      }
#endif
    }
    pr->u.p.parm1 = chunk;
  }
  KMP_ASSERT2((kmp_sch_lower < schedule && schedule < kmp_sch_upper),
              "unknown scheduling type");

  pr->u.p.count = 0;

  if (__kmp_env_consistency_check) {
    if (st == 0) {
      __kmp_error_construct(kmp_i18n_msg_CnsLoopIncrZeroProhibited,
                            (pr->flags.ordered ? ct_pdo_ordered : ct_pdo), loc);
    }
  }
  // compute trip count
  if (st == 1) { // most common case
    if (ub >= lb) {
      tc = ub - lb + 1;
    } else { // ub < lb
      tc = 0; // zero-trip
    }
  } else if (st < 0) {
    if (lb >= ub) {
      // AC: cast to unsigned is needed for loops like (i=2B; i>-2B; i-=1B),
      // where the division needs to be unsigned regardless of the result type
      tc = (UT)(lb - ub) / (-st) + 1;
    } else { // lb < ub
      tc = 0; // zero-trip
    }
  } else { // st > 0
    if (ub >= lb) {
      // AC: cast to unsigned is needed for loops like (i=-2B; i<2B; i+=1B),
      // where the division needs to be unsigned regardless of the result type
      tc = (UT)(ub - lb) / st + 1;
    } else { // ub < lb
      tc = 0; // zero-trip
    }
  }

#if KMP_STATS_ENABLED
  if (KMP_MASTER_GTID(gtid)) {
    KMP_COUNT_VALUE(OMP_loop_dynamic_total_iterations, tc);
  }
#endif

  pr->u.p.lb = lb;
  pr->u.p.ub = ub;
  pr->u.p.st = st;
  pr->u.p.tc = tc;

#if KMP_OS_WINDOWS
  pr->u.p.last_upper = ub + st;
#endif /* KMP_OS_WINDOWS */

  /* NOTE: only the active parallel region(s) has active ordered sections */

  if (active) {
    if (pr->flags.ordered) {
      pr->ordered_bumped = 0;
      pr->u.p.ordered_lower = 1;
      pr->u.p.ordered_upper = 0;
    }
  }

  switch (schedule) {
#if (KMP_STATIC_STEAL_ENABLED)
  case kmp_sch_static_steal: {
    T ntc, init;

    KD_TRACE(100,
             ("__kmp_dispatch_init_algorithm: T#%d kmp_sch_static_steal case\n",
              gtid));

    ntc = (tc % chunk ? 1 : 0) + tc / chunk;
    if (nproc > 1 && ntc >= nproc) {
      KMP_COUNT_BLOCK(OMP_LOOP_STATIC_STEAL);
      T id = tid;
      T small_chunk, extras;

      small_chunk = ntc / nproc;
      extras = ntc % nproc;

      init = id * small_chunk + (id < extras ? id : extras);
      pr->u.p.count = init;
      pr->u.p.ub = init + small_chunk + (id < extras ? 1 : 0);

      pr->u.p.parm2 = lb;
      // parm3 is the number of times to attempt stealing which is
      // proportional to the number of chunks per thread up until
      // the maximum value of nproc.
      pr->u.p.parm3 = KMP_MIN(small_chunk + extras, nproc);
      pr->u.p.parm4 = (id + 1) % nproc; // remember neighbour tid
      pr->u.p.st = st;
      if (traits_t<T>::type_size > 4) {
        // AC: TODO: check if 16-byte CAS available and use it to
        // improve performance (probably wait for explicit request
        // before spending time on this).
        // For now use dynamically allocated per-thread lock,
        // free memory in __kmp_dispatch_next when status==0.
        KMP_DEBUG_ASSERT(th->th.th_dispatch->th_steal_lock == NULL);
        th->th.th_dispatch->th_steal_lock =
            (kmp_lock_t *)__kmp_allocate(sizeof(kmp_lock_t));
        __kmp_init_lock(th->th.th_dispatch->th_steal_lock);
      }
      break;
    } else {
      KD_TRACE(100, ("__kmp_dispatch_init_algorithm: T#%d falling-through to "
                     "kmp_sch_static_balanced\n",
                     gtid));
      schedule = kmp_sch_static_balanced;
      /* too few iterations: fall-through to kmp_sch_static_balanced */
    } // if
    /* FALL-THROUGH to static balanced */
    KMP_FALLTHROUGH();
  } // case
#endif
  case kmp_sch_static_balanced: {
    T init, limit;

    KD_TRACE(
        100,
        ("__kmp_dispatch_init_algorithm: T#%d kmp_sch_static_balanced case\n",
         gtid));

    if (nproc > 1) {
      T id = tid;

      if (tc < nproc) {
        if (id < tc) {
          init = id;
          limit = id;
          pr->u.p.parm1 = (id == tc - 1); /* parm1 stores *plastiter */
        } else {
          pr->u.p.count = 1; /* means no more chunks to execute */
          pr->u.p.parm1 = FALSE;
          break;
        }
      } else {
        T small_chunk = tc / nproc;
        T extras = tc % nproc;
        init = id * small_chunk + (id < extras ? id : extras);
        limit = init + small_chunk - (id < extras ? 0 : 1);
        pr->u.p.parm1 = (id == nproc - 1);
      }
    } else {
      if (tc > 0) {
        init = 0;
        limit = tc - 1;
        pr->u.p.parm1 = TRUE;
      } else {
        // zero trip count
        pr->u.p.count = 1; /* means no more chunks to execute */
        pr->u.p.parm1 = FALSE;
        break;
      }
    }
#if USE_ITT_BUILD
    // Calculate chunk for metadata report
    if (itt_need_metadata_reporting)
      if (cur_chunk)
        *cur_chunk = limit - init + 1;
#endif
    if (st == 1) {
      pr->u.p.lb = lb + init;
      pr->u.p.ub = lb + limit;
    } else {
      // calculated upper bound, "ub" is user-defined upper bound
      T ub_tmp = lb + limit * st;
      pr->u.p.lb = lb + init * st;
      // adjust upper bound to "ub" if needed, so that MS lastprivate will match
      // it exactly
      if (st > 0) {
        pr->u.p.ub = (ub_tmp + st > ub ? ub : ub_tmp);
      } else {
        pr->u.p.ub = (ub_tmp + st < ub ? ub : ub_tmp);
      }
    }
    if (pr->flags.ordered) {
      pr->u.p.ordered_lower = init;
      pr->u.p.ordered_upper = limit;
    }
    break;
  } // case
  case kmp_sch_static_balanced_chunked: {
    // similar to balanced, but chunk adjusted to multiple of simd width
    T nth = nproc;
    KD_TRACE(100, ("__kmp_dispatch_init_algorithm: T#%d runtime(simd:static)"
                   " -> falling-through to static_greedy\n",
                   gtid));
    schedule = kmp_sch_static_greedy;
    if (nth > 1)
      pr->u.p.parm1 = ((tc + nth - 1) / nth + chunk - 1) & ~(chunk - 1);
    else
      pr->u.p.parm1 = tc;
    break;
  } // case
  case kmp_sch_guided_simd:
  case kmp_sch_guided_iterative_chunked: {
    KD_TRACE(
        100,
        ("__kmp_dispatch_init_algorithm: T#%d kmp_sch_guided_iterative_chunked"
         " case\n",
         gtid));

    if (nproc > 1) {
      if ((2L * chunk + 1) * nproc >= tc) {
        /* chunk size too large, switch to dynamic */
        schedule = kmp_sch_dynamic_chunked;
      } else {
        // when remaining iters become less than parm2 - switch to dynamic
        pr->u.p.parm2 = guided_int_param * nproc * (chunk + 1);
        *(double *)&pr->u.p.parm3 =
            guided_flt_param / nproc; // may occupy parm3 and parm4
      }
    } else {
      KD_TRACE(100, ("__kmp_dispatch_init_algorithm: T#%d falling-through to "
                     "kmp_sch_static_greedy\n",
                     gtid));
      schedule = kmp_sch_static_greedy;
      /* team->t.t_nproc == 1: fall-through to kmp_sch_static_greedy */
      KD_TRACE(
          100,
          ("__kmp_dispatch_init_algorithm: T#%d kmp_sch_static_greedy case\n",
           gtid));
      pr->u.p.parm1 = tc;
    } // if
  } // case
  break;
  case kmp_sch_guided_analytical_chunked: {
    KD_TRACE(100, ("__kmp_dispatch_init_algorithm: T#%d "
                   "kmp_sch_guided_analytical_chunked case\n",
                   gtid));

    if (nproc > 1) {
      if ((2L * chunk + 1) * nproc >= tc) {
        /* chunk size too large, switch to dynamic */
        schedule = kmp_sch_dynamic_chunked;
      } else {
        /* commonly used term: (2 nproc - 1)/(2 nproc) */
        DBL x;

#if KMP_USE_X87CONTROL
        /* Linux* OS already has 64-bit computation by default for long double,
           and on Windows* OS on Intel(R) 64, /Qlong_double doesn't work. On
           Windows* OS on IA-32 architecture, we need to set precision to 64-bit
           instead of the default 53-bit. Even though long double doesn't work
           on Windows* OS on Intel(R) 64, the resulting lack of precision is not
           expected to impact the correctness of the algorithm, but this has not
           been mathematically proven. */
        // save original FPCW and set precision to 64-bit, as
        // Windows* OS on IA-32 architecture defaults to 53-bit
        unsigned int oldFpcw = _control87(0, 0);
        _control87(_PC_64, _MCW_PC); // 0,0x30000
#endif
        /* value used for comparison in solver for cross-over point */
        long double target = ((long double)chunk * 2 + 1) * nproc / tc;

        /* crossover point--chunk indexes equal to or greater than
           this point switch to dynamic-style scheduling */
        UT cross;

        /* commonly used term: (2 nproc - 1)/(2 nproc) */
        x = (long double)1.0 - (long double)0.5 / nproc;

#ifdef KMP_DEBUG
        { // test natural alignment
          struct _test_a {
            char a;
            union {
              char b;
              DBL d;
            };
          } t;
          ptrdiff_t natural_alignment =
              (ptrdiff_t)&t.b - (ptrdiff_t)&t - (ptrdiff_t)1;
          //__kmp_warn( " %llx %llx %lld", (long long)&t.d, (long long)&t, (long
          // long)natural_alignment );
          KMP_DEBUG_ASSERT(
              (((ptrdiff_t)&pr->u.p.parm3) & (natural_alignment)) == 0);
        }
#endif // KMP_DEBUG

        /* save the term in thread private dispatch structure */
        *(DBL *)&pr->u.p.parm3 = x;

        /* solve for the crossover point to the nearest integer i for which C_i
           <= chunk */
        {
          UT left, right, mid;
          long double p;

          /* estimate initial upper and lower bound */

          /* doesn't matter what value right is as long as it is positive, but
             it affects performance of the solver */
          right = 229;
          p = __kmp_pow<UT>(x, right);
          if (p > target) {
            do {
              p *= p;
              right <<= 1;
            } while (p > target && right < (1 << 27));
            /* lower bound is previous (failed) estimate of upper bound */
            left = right >> 1;
          } else {
            left = 0;
          }

          /* bisection root-finding method */
          while (left + 1 < right) {
            mid = (left + right) / 2;
            if (__kmp_pow<UT>(x, mid) > target) {
              left = mid;
            } else {
              right = mid;
            }
          } // while
          cross = right;
        }
        /* assert sanity of computed crossover point */
        KMP_ASSERT(cross && __kmp_pow<UT>(x, cross - 1) > target &&
                   __kmp_pow<UT>(x, cross) <= target);

        /* save the crossover point in thread private dispatch structure */
        pr->u.p.parm2 = cross;

// C75803
#if ((KMP_OS_LINUX || KMP_OS_WINDOWS) && KMP_ARCH_X86) && (!defined(KMP_I8))
#define GUIDED_ANALYTICAL_WORKAROUND (*(DBL *)&pr->u.p.parm3)
#else
#define GUIDED_ANALYTICAL_WORKAROUND (x)
#endif
        /* dynamic-style scheduling offset */
        pr->u.p.count = tc - __kmp_dispatch_guided_remaining(
                                 tc, GUIDED_ANALYTICAL_WORKAROUND, cross) -
                        cross * chunk;
#if KMP_USE_X87CONTROL
        // restore FPCW
        _control87(oldFpcw, _MCW_PC);
#endif
      } // if
    } else {
      KD_TRACE(100, ("__kmp_dispatch_init_algorithm: T#%d falling-through to "
                     "kmp_sch_static_greedy\n",
                     gtid));
      schedule = kmp_sch_static_greedy;
      /* team->t.t_nproc == 1: fall-through to kmp_sch_static_greedy */
      pr->u.p.parm1 = tc;
    } // if
  } // case
  break;
  case kmp_sch_static_greedy:
    KD_TRACE(
        100,
        ("__kmp_dispatch_init_algorithm: T#%d kmp_sch_static_greedy case\n",
         gtid));
    pr->u.p.parm1 = (nproc > 1) ? (tc + nproc - 1) / nproc : tc;
    break;
  case kmp_sch_static_chunked:
  case kmp_sch_dynamic_chunked:
    if (pr->u.p.parm1 <= 0) {
      pr->u.p.parm1 = KMP_DEFAULT_CHUNK;
    }
    KD_TRACE(100, ("__kmp_dispatch_init_algorithm: T#%d "
                   "kmp_sch_static_chunked/kmp_sch_dynamic_chunked cases\n",
                   gtid));
    break;
  case kmp_sch_trapezoidal: {
    /* TSS: trapezoid self-scheduling, minimum chunk_size = parm1 */

    T parm1, parm2, parm3, parm4;
    KD_TRACE(100,
             ("__kmp_dispatch_init_algorithm: T#%d kmp_sch_trapezoidal case\n",
              gtid));

    parm1 = chunk;

    /* F : size of the first cycle */
    parm2 = (tc / (2 * nproc));

    if (parm2 < 1) {
      parm2 = 1;
    }

    /* L : size of the last cycle.  Make sure the last cycle is not larger
       than the first cycle. */
    if (parm1 < 1) {
      parm1 = 1;
    } else if (parm1 > parm2) {
      parm1 = parm2;
    }

    /* N : number of cycles */
    parm3 = (parm2 + parm1);
    parm3 = (2 * tc + parm3 - 1) / parm3;

    if (parm3 < 2) {
      parm3 = 2;
    }

    /* sigma : decreasing incr of the trapezoid */
    parm4 = (parm3 - 1);
    parm4 = (parm2 - parm1) / parm4;

    // pointless check, because parm4 >= 0 always
    // if ( parm4 < 0 ) {
    //    parm4 = 0;
    //}

    pr->u.p.parm1 = parm1;
    pr->u.p.parm2 = parm2;
    pr->u.p.parm3 = parm3;
    pr->u.p.parm4 = parm4;
  } // case
  break;

  default: {
    __kmp_fatal(KMP_MSG(UnknownSchedTypeDetected), // Primary message
                KMP_HNT(GetNewerLibrary), // Hint
                __kmp_msg_null // Variadic argument list terminator
                );
  } break;
  } // switch
  pr->schedule = schedule;
}